

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyManager::VerifyCommitDrop
          (DependencyManager *this,CatalogTransaction transaction,transaction_t start_time,
          CatalogEntry *object)

{
  bool bVar1;
  transaction_t start_time_local;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  CatalogEntryInfo info;
  
  start_time_local = start_time;
  bVar1 = IsSystemEntry(this,object);
  if (!bVar1) {
    GetLookupProperties(&info,object);
    local_78 = ::std::
               _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:474:36)>
               ::_M_invoke;
    local_80 = ::std::
               _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:474:36)>
               ::_M_manager;
    local_90._M_unused._M_object = &start_time_local;
    local_90._8_8_ = object;
    ScanSetInternal(this,transaction,&info,false,(dependency_callback_t *)&local_90);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_90);
    local_78 = ::std::
               _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:488:34)>
               ::_M_invoke;
    local_80 = ::std::
               _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:488:34)>
               ::_M_manager;
    local_90._M_unused._M_object = &start_time_local;
    local_90._8_8_ = object;
    ScanSetInternal(this,transaction,&info,true,(dependency_callback_t *)&local_90);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_90);
    CatalogEntryInfo::~CatalogEntryInfo(&info);
  }
  return;
}

Assistant:

void DependencyManager::VerifyCommitDrop(CatalogTransaction transaction, transaction_t start_time,
                                         CatalogEntry &object) {
	if (IsSystemEntry(object)) {
		return;
	}
	auto info = GetLookupProperties(object);
	ScanDependents(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (dep_committed_at > start_time) {
			// In the event of a CASCADE, the dependency drop has not committed yet
			// so we would be halted by the existence of a dependency we are already dropping unless we check the
			// timestamp
			//
			// Which differentiates between objects that we were already aware of (and will subsequently be dropped) and
			// objects that were introduced inbetween, which should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
	ScanSubjects(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (!dep.Dependent().flags.IsOwnedBy()) {
			return;
		}
		D_ASSERT(dep.Subject().flags.IsOwnership());
		if (dep_committed_at > start_time) {
			// Same as above, objects that are owned by the object that is being dropped will be dropped as part of this
			// transaction. Only objects that were introduced by other transactions, that this transaction could not
			// see, should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
}